

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::erase(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,key_type *key)

{
  InfoType IVar1;
  uint8_t *puVar2;
  pointer __s1;
  size_t __n;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_type *psVar6;
  uint uVar7;
  
  sVar5 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,key);
  IVar1 = this->mInfoInc;
  uVar7 = (((uint)sVar5 & 0x1f) >> ((byte)this->mInfoHashShift & 0x3f)) + IVar1;
  sVar5 = sVar5 >> 5 & this->mMask;
  puVar2 = this->mInfo;
  __s1 = (key->_M_dataplus)._M_p;
  __n = key->_M_string_length;
  uVar4 = (uint)puVar2[sVar5];
  psVar6 = &this->mKeyVals[sVar5].mData.first._M_string_length;
  while (((uVar7 != uVar4 || (__n != *psVar6)) ||
         ((__n != 0 &&
          (iVar3 = bcmp(__s1,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (psVar6 + -1))->_M_dataplus)._M_p,__n), iVar3 != 0))))) {
    uVar7 = uVar7 + IVar1;
    uVar4 = (uint)puVar2[sVar5 + 1];
    sVar5 = sVar5 + 1;
    psVar6 = psVar6 + 5;
    if (uVar4 < uVar7) {
      return 0;
    }
  }
  shiftDown(this,sVar5);
  this->mNumElements = this->mNumElements - 1;
  return 1;
}

Assistant:

size_t erase(const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        // check while info matches with the source idx
        do {
            if (info == mInfo[idx] && WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                shiftDown(idx);
                --mNumElements;
                return 1;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found to delete
        return 0;
    }